

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O3

void rgbcx::prepare_bc1_single_color_table
               (bc1_match_entry *pTable,uint8_t *pExpand,int size,bc1_approx_mode mode)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int i;
  long lVar6;
  bc1_match_entry *pbVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  
  lVar6 = 0;
  do {
    if (0 < size) {
      pbVar7 = pTable + lVar6;
      iVar5 = 0x100;
      uVar4 = 0;
      uVar11 = 0;
      do {
        bVar1 = pExpand[uVar11];
        uVar13 = 0;
        uVar12 = uVar4;
        do {
          bVar2 = pExpand[uVar13];
          iVar9 = (int)lVar6;
          if (size == 0x20) {
            if (mode == cBC1IdealRound4) {
LAB_00117a93:
              iVar9 = (bVar1 + 1 + (uint)bVar2 * 2) / 3 - iVar9;
              iVar14 = -iVar9;
              if (0 < iVar9) {
                iVar14 = iVar9;
              }
              goto LAB_00117ad4;
            }
            if (mode == cBC1AMD) {
LAB_00117a7a:
              uVar8 = (uint)bVar2 * 0x2b + (uint)bVar1 + ((uint)bVar1 + (uint)bVar1 * 4) * 4 + 0x20
                      >> 6;
            }
            else {
              if (mode != cBC1NVidia) goto LAB_00117ab5;
              uVar8 = (uint)(uVar12 >> 3);
            }
LAB_00117a85:
            iVar9 = uVar8 - iVar9;
            iVar14 = -iVar9;
            if (0 < iVar9) {
              iVar14 = iVar9;
            }
          }
          else {
            if (mode == cBC1IdealRound4) goto LAB_00117a93;
            if (mode == cBC1AMD) goto LAB_00117a7a;
            if (mode == cBC1NVidia) {
              iVar10 = (uint)bVar1 - (uint)bVar2;
              iVar14 = iVar10 + 3;
              if (-1 < iVar10) {
                iVar14 = iVar10;
              }
              iVar14 = (iVar14 >> 2) + (uint)bVar2 * 0x100;
              iVar3 = iVar10 * 0x50 + iVar14 + 0x80;
              iVar14 = iVar10 * 0x50 + iVar14 + 0x17f;
              if (-1 < iVar3) {
                iVar14 = iVar3;
              }
              uVar8 = iVar14 >> 8;
              goto LAB_00117a85;
            }
LAB_00117ab5:
            iVar9 = ((uint)bVar1 + (uint)bVar2 * 2) / 3 - iVar9;
            iVar14 = -iVar9;
            if (0 < iVar9) {
              iVar14 = iVar9;
            }
            if (mode != cBC1Ideal) goto LAB_00117af6;
LAB_00117ad4:
            iVar10 = (uint)bVar2 - (uint)bVar1;
            iVar9 = -iVar10;
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            iVar14 = (int)((ulong)(uint)(iVar9 * 3) * 0x28f5c29 >> 0x20) + iVar14;
          }
LAB_00117af6:
          if ((iVar14 < iVar5) || ((uVar11 == uVar13 && (iVar14 == iVar5)))) {
            pbVar7->m_hi = (uint8_t)uVar13;
            pbVar7->m_lo = (uint8_t)uVar11;
            pbVar7->m_e = (uint8_t)iVar14;
            iVar5 = iVar14;
          }
          uVar13 = uVar13 + 1;
          uVar12 = (ulong)((int)uVar12 + 0x2c);
        } while ((uint)size != uVar13);
        uVar11 = uVar11 + 1;
        uVar4 = (ulong)((int)uVar4 + 0x16);
      } while (uVar11 != (uint)size);
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 0x100) {
      return;
    }
  } while( true );
}

Assistant:

static void prepare_bc1_single_color_table(bc1_match_entry* pTable, const uint8_t* pExpand, int size, bc1_approx_mode mode)
	{
		for (int i = 0; i < 256; i++)
		{
			int lowest_e = 256;
			for (int lo = 0; lo < size; lo++)
			{
				const int lo_e = pExpand[lo];

				for (int hi = 0; hi < size; hi++)
				{
					const int hi_e = pExpand[hi];

					const int v = (size == 32) ? interp_5(hi, lo, hi_e, lo_e, mode) : interp_6(hi, lo, hi_e, lo_e, mode);
					
					int e = iabs(v - i);

					if ((mode == bc1_approx_mode::cBC1Ideal) || (mode == bc1_approx_mode::cBC1IdealRound4))
						e += (iabs(hi_e - lo_e) * 3) / 100;

					// Favor equal endpoints, for lower error on actual GPU's which approximate the interpolation.
					if ((e < lowest_e) || ((e == lowest_e) && (lo == hi)))
					{
						pTable[i].m_hi = static_cast<uint8_t>(hi);
						pTable[i].m_lo = static_cast<uint8_t>(lo);
						
						assert(e <= UINT8_MAX);
						pTable[i].m_e = static_cast<uint8_t>(e);

						lowest_e = e;
					}

				} // hi
			} // lo
		}
	}